

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_details::load(xr_scene_details *this,xr_reader *r)

{
  uint uVar1;
  uint *puVar2;
  uint8_t *puVar3;
  uint32_t *puVar4;
  size_t sVar5;
  detail_slot_v3 *values;
  char *__assertion;
  ulong n;
  uint32_t version;
  xr_reader *s;
  
  xr_scene_revision::load(&(this->super_xr_scene_part).m_revision,r);
  sVar5 = xr_reader::r_chunk<unsigned_int>(r,0x1000,&version);
  if (sVar5 == 0) {
    __assertion = "0";
    uVar1 = 0x42;
  }
  else if (version == 3) {
    xr_reader::r_chunk<unsigned_int>(r,0x1006,&this->m_flags);
    sVar5 = xr_reader::find_chunk(r,0);
    if (sVar5 == 0) {
      __assertion = "0";
      uVar1 = 0x47;
    }
    else {
      details_header::load(&this->m_header,r);
      sVar5 = xr_reader::find_chunk(r,2);
      if (sVar5 == 0) {
        __assertion = "0";
        uVar1 = 0x4c;
      }
      else {
        puVar2 = (r->field_2).m_p_u32;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        uVar1 = *puVar2;
        n = (ulong)uVar1;
        this->m_num_slots = uVar1;
        if (n != 0) {
          if (uVar1 != (this->m_header).size_z * (this->m_header).size_x) {
            __assertion = "m_num_slots == m_header.size_x*m_header.size_z";
            uVar1 = 0x4e;
            goto LAB_00177278;
          }
          values = (detail_slot_v3 *)operator_new__(n << 4);
          this->m_slots = values;
          xr_reader::r_cseq<xray_re::detail_slot_v3>(r,n,values);
        }
        s = xr_reader::open_chunk(r,1);
        if (s != (xr_reader *)0x0) {
          xr_reader::
          r_chunks<std::vector<xray_re::detail_object*,std::allocator<xray_re::detail_object*>>,read_detail>
                    (s,&this->m_objects);
          xr_reader::close_chunk(r,&s);
        }
        sVar5 = xr_reader::find_chunk(r,0x1003);
        if (sVar5 == 0) {
          __assertion = "0";
          uVar1 = 0x5b;
        }
        else {
          puVar3 = (r->field_2).m_p;
          (r->field_2).m_p = puVar3 + 1;
          xr_reader::
          r_seq<std::vector<xray_re::color_index*,std::allocator<xray_re::color_index*>>,read_color_index>
                    (r,*puVar3,&this->m_indices);
          sVar5 = xr_reader::r_chunk<xray_re::_aabb<float>>(r,0x1001,&this->m_bbox);
          if (sVar5 != 0) {
            sVar5 = xr_reader::find_chunk(r,0x1004);
            if (sVar5 != 0) {
              puVar4 = (r->field_2).m_p_u32;
              (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
              xr_reader::
              r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
                        (r,*puVar4,&this->m_snap_objects);
            }
            xr_reader::r_chunk<float>(r,0x1005,&this->m_density);
            sVar5 = xr_reader::find_chunk(r,0x1002);
            if (sVar5 != 0) {
              xr_reader::r_sz(r,&this->m_texture);
            }
            return;
          }
          __assertion = "0";
          uVar1 = 0x60;
        }
      }
    }
  }
  else {
    __assertion = "version == DETMGR_VERSION";
    uVar1 = 0x43;
  }
LAB_00177278:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_details.cxx"
                ,uVar1,"virtual void xray_re::xr_scene_details::load(xr_reader &)");
}

Assistant:

void xr_scene_details::load(xr_reader& r)
{
	revision().load(r);

	uint32_t version;
	if (!r.r_chunk<uint32_t>(DETMGR_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == DETMGR_VERSION);

	r.r_chunk<uint32_t>(DETMGR_CHUNK_FLAGS, m_flags);
	if (!r.find_chunk(DETMGR_CHUNK_HEADER))
		xr_not_expected();
	m_header.load(r);
	r.debug_find_chunk();

	if (!r.find_chunk(DETMGR_CHUNK_SLOTS))
		xr_not_expected();
	if ((m_num_slots = r.r_u32())) {
		xr_assert(m_num_slots == m_header.size_x*m_header.size_z);
		m_slots = new detail_slot_v3[m_num_slots];
		r.r_cseq(m_num_slots, m_slots);
	}
	r.debug_find_chunk();

	xr_reader* s = r.open_chunk(DETMGR_CHUNK_OBJECTS);
	if (s) {
		s->r_chunks(m_objects, read_detail());
		r.close_chunk(s);
	}

	if (!r.find_chunk(DETMGR_CHUNK_COLOR_INDEX))
		xr_not_expected();
	r.r_seq(r.r_u8(), m_indices, read_color_index());
	r.debug_find_chunk();

	if (!r.r_chunk(DETMGR_CHUNK_BBOX, m_bbox))
		xr_not_expected();

	if (r.find_chunk(DETMGR_CHUNK_SNAP_OBJECTS))
		r.r_seq(r.r_u32(), m_snap_objects, xr_reader::f_r_sz());

	r.r_chunk(DETMGR_CHUNK_DENSITY, m_density);

	if (r.find_chunk(DETMGR_CHUNK_TEXTURE)) {
		r.r_sz(m_texture);
		r.debug_find_chunk();
	}
}